

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_subquery.cpp
# Opt level: O3

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::Transformer::TransformRangeSubselect(Transformer *this,PGRangeSubselect *root)

{
  PGAlias *root_00;
  undefined8 uVar1;
  Transformer *this_00;
  pointer pSVar2;
  long in_RDX;
  Transformer subquery_transformer;
  _Head_base<0UL,_duckdb::SubqueryRef_*,_false> local_130;
  undefined1 local_128 [8];
  undefined1 local_120 [16];
  undefined1 local_110 [232];
  
  Transformer((Transformer *)(local_110 + 0x18),(Transformer *)root);
  TransformSelectStmt((Transformer *)local_128,(PGNode *)(local_110 + 0x18),
                      SUB81(*(undefined8 *)(in_RDX + 8),0));
  if (local_128 == (undefined1  [8])0x0) {
    (this->parent).ptr = (Transformer *)0x0;
  }
  else {
    this_00 = (Transformer *)operator_new(0x70);
    local_110._16_8_ = local_128;
    local_128 = (undefined1  [8])0x0;
    local_120._8_8_ = (ParserOptions *)0x0;
    local_110[0] = INVALID;
    local_120._0_8_ = (pointer)local_110;
    SubqueryRef::SubqueryRef
              ((SubqueryRef *)this_00,
               (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                *)(local_110 + 0x10),(string *)local_120);
    local_130._M_head_impl = (SubqueryRef *)this_00;
    if ((pointer)local_120._0_8_ != (pointer)local_110) {
      operator_delete((void *)local_120._0_8_);
    }
    if ((Transformer *)local_110._16_8_ != (Transformer *)0x0) {
      (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_110._16_8_)->ptr->options)();
    }
    root_00 = *(PGAlias **)(in_RDX + 0x10);
    pSVar2 = unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
             operator->((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                         *)&local_130);
    TransformAlias((string *)local_120,(Transformer *)root,root_00,
                   &(pSVar2->super_TableRef).column_name_alias);
    pSVar2 = unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
             operator->((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                         *)&local_130);
    ::std::__cxx11::string::operator=((string *)&(pSVar2->super_TableRef).alias,(string *)local_120)
    ;
    if ((pointer)local_120._0_8_ != (pointer)local_110) {
      operator_delete((void *)local_120._0_8_);
    }
    if (*(long *)(in_RDX + 0x18) != 0) {
      TransformSampleOptions
                ((Transformer *)local_120,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
      pSVar2 = unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
               operator->((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                           *)&local_130);
      uVar1 = local_120._0_8_;
      local_120._0_8_ = (pointer)0x0;
      ::std::__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>::
      reset((__uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> *)
            &(pSVar2->super_TableRef).sample,(pointer)uVar1);
      uVar1 = local_120._0_8_;
      if ((pointer)local_120._0_8_ != (pointer)0x0) {
        Value::~Value((Value *)local_120._0_8_);
        operator_delete((void *)uVar1);
      }
    }
    (this->parent).ptr = (Transformer *)local_130._M_head_impl;
    if (local_128 != (undefined1  [8])0x0) {
      (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_128)->ptr->options)();
    }
  }
  ~Transformer((Transformer *)(local_110 + 0x18));
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> Transformer::TransformRangeSubselect(duckdb_libpgquery::PGRangeSubselect &root) {
	Transformer subquery_transformer(*this);
	auto subquery = subquery_transformer.TransformSelectStmt(*root.subquery);
	if (!subquery) {
		return nullptr;
	}
	auto result = make_uniq<SubqueryRef>(std::move(subquery));
	result->alias = TransformAlias(root.alias, result->column_name_alias);
	if (root.sample) {
		result->sample = TransformSampleOptions(root.sample);
	}
	return std::move(result);
}